

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

basic_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>,_header_type,_unodb::db>
 unodb::detail::
 make_db_leaf_ptr<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db>
           (art_key_type k,value_view v,
           db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *db)

{
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header> *this;
  length_error *this_00;
  _Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  _Var1;
  db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *in_R9;
  art_key_type k_00;
  basic_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>,_header_type,_unodb::db>
  bVar2;
  value_view v_00;
  _Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_false>
  extraout_RDX;
  
  k_00.field_0._0_8_ = k.field_0._8_8_;
  _Var1.
  super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
  ._M_head_impl.db = k.field_0._0_8_;
  v_00._M_ptr = v._M_extent._M_extent_value;
  k_00.field_0._8_8_ = v._M_ptr;
  if ((ulong)k_00.field_0._8_8_ >> 0x20 == 0) {
    if ((ulong)db >> 0x20 == 0) {
      this = (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
              *)allocate_aligned((size_t)(k_00.field_0._8_8_ + (long)db + 0xb),0x10);
      db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
      ::increment_leaf_count(in_R9,(size_t)(k_00.field_0._8_8_ + (long)db + 0xb));
      v_00._M_extent._M_extent_value = (size_t)db;
      basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>::
      basic_leaf(this,k_00,v_00);
      *(db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
        **)_Var1.
           super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
           ._M_head_impl.db = in_R9;
      *(basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
        **)((long)_Var1.
                  super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                  ._M_head_impl.db + 8) = this;
      bVar2._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_false>
      ._M_head_impl = extraout_RDX._M_head_impl;
      bVar2._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
      ._M_head_impl.db =
           _Var1.
           super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
           ._M_head_impl.db;
      return (basic_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>,_header_type,_unodb::db>
              )bVar2._M_t.
               super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ;
    }
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"Value length must fit in std::uint32_t");
  }
  else {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"Key length must fit in std::uint32_t");
  }
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

[[nodiscard]] auto make_db_leaf_ptr(
    basic_art_key<Key> k, value_view v,
    Db<Key, Value> &db UNODB_DETAIL_LIFETIMEBOUND) {
  using db_type = Db<Key, Value>;
  using header_type = typename db_type::header_type;
  using leaf_type = basic_leaf<Key, header_type>;

  // TODO(thompsonbry) We should have a discussion about limits.  To
  // my mind, limits should be explicit configuration values, not
  // uint32_t.
  if constexpr (std::is_same_v<Key, key_view>) {
    if (UNODB_DETAIL_UNLIKELY(k.size() > leaf_type::max_key_size)) {
      throw std::length_error("Key length must fit in std::uint32_t");
    }
  }

  if (UNODB_DETAIL_UNLIKELY(v.size_bytes() > leaf_type::max_value_size)) {
    throw std::length_error("Value length must fit in std::uint32_t");
  }

  const auto size = leaf_type::compute_size(
      static_cast<typename leaf_type::key_size_type>(k.size()),
      static_cast<typename leaf_type::value_size_type>(v.size_bytes()));

  auto *const leaf_mem = static_cast<std::byte *>(
      allocate_aligned(size, alignment_for_new<leaf_type>()));

#ifdef UNODB_DETAIL_WITH_STATS
  db.increment_leaf_count(size);
#endif  // UNODB_DETAIL_WITH_STATS

  return basic_db_leaf_unique_ptr<Key, Value, header_type, Db>{
      new (leaf_mem) leaf_type{k, v}, basic_db_leaf_deleter<db_type>{db}};
}